

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O1

bool ccs::CcsContext::coerceString<bool>(string *s,bool *dest)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"true","");
  sVar1 = s->_M_string_length;
  if (sVar1 == local_40) {
    if (sVar1 == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp((s->_M_dataplus)._M_p,local_48,sVar1);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  bVar2 = true;
  if (!bVar4) {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"false","");
    sVar1 = s->_M_string_length;
    if (sVar1 == local_40) {
      if (sVar1 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp((s->_M_dataplus)._M_p,local_48,sVar1);
        bVar4 = iVar3 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    bVar2 = false;
    if (!bVar4) {
      return false;
    }
  }
  *dest = bVar2;
  return true;
}

Assistant:

inline bool CcsContext::coerceString<bool>(const std::string &s,
    bool &dest) {
  // convert from a string to a bool: value must be exactly "true" or "false",
  // for maximum consistency with ccs boolean literals.
  if (s == std::string("true")) {
    dest = true;
    return true;
  }
  if (s == std::string("false")) {
    dest = false;
    return true;
  }
  return false;
}